

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O1

bool __thiscall
cmSourceGroupCommand::InitialPass
          (cmSourceGroupCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  pointer pbVar10;
  bool bVar11;
  string delimiter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  string src;
  allocator local_231;
  cmSourceGroup *local_230;
  ulong local_228;
  string local_220;
  string local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    bVar11 = false;
  }
  else {
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\\","");
    pcVar1 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"SOURCE_GROUP_DELIMITER","")
    ;
    pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar4 != (char *)0x0) {
      pcVar1 = (this->super_cmCommand).Makefile;
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"SOURCE_GROUP_DELIMITER","");
      pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
      strlen(pcVar4);
      std::__cxx11::string::_M_replace
                ((ulong)&local_200,0,(char *)local_200._M_string_length,(ulong)pcVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
    }
    cmSystemTools::tokenize
              (&local_1e0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,&local_200);
    local_230 = cmMakefile::GetSourceGroup((this->super_cmCommand).Makefile,&local_1e0);
    if (local_230 == (cmSourceGroup *)0x0) {
      cmMakefile::AddSourceGroup((this->super_cmCommand).Makefile,&local_1e0,(char *)0x0);
      local_230 = cmMakefile::GetSourceGroup((this->super_cmCommand).Makefile,&local_1e0);
    }
    if (local_230 == (cmSourceGroup *)0x0) {
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Could not create or find source group","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
LAB_0034b0bc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
LAB_0034b0e1:
      bVar11 = false;
    }
    else {
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 == 0x40) &&
         (iVar3 = std::__cxx11::string::compare((char *)(pbVar10 + 1)), iVar3 != 0)) {
        bVar11 = true;
        cmSourceGroup::SetGroupRegex
                  (local_230,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      }
      else {
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        bVar11 = (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) < 0x21;
        if (!bVar11) {
          uVar9 = 1;
          local_228 = 0;
          do {
            uVar8 = (uint)uVar9;
            iVar3 = std::__cxx11::string::compare((char *)(pbVar10 + uVar9));
            if (iVar3 == 0) {
              uVar8 = uVar8 + 1;
              pbVar10 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5) <=
                  (ulong)uVar8) {
                local_1a8._0_8_ = local_198;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"REGULAR_EXPRESSION argument given without a regex.",
                           "");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
                goto LAB_0034b0bc;
              }
              cmSourceGroup::SetGroupRegex(local_230,pbVar10[uVar8]._M_dataplus._M_p);
              local_228 = 0;
            }
            else {
              uVar5 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar9));
              if ((int)uVar5 == 0) {
                local_228 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
              }
              else {
                if ((local_228 & 1) == 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unknown argument \"",0x12);
                  pbVar10 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,pbVar10[uVar9]._M_dataplus._M_p,
                                      pbVar10[uVar9]._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"Perhaps the FILES keyword is missing.\n",0x26);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_220);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != &local_220.field_2) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  goto LAB_0034b0e1;
                }
                pbVar10 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_1a8._0_8_ = local_198;
                pcVar2 = pbVar10[uVar9]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1a8,pcVar2,pcVar2 + pbVar10[uVar9]._M_string_length);
                bVar11 = cmsys::SystemTools::FileIsFullPath((char *)local_1a8._0_8_);
                if (!bVar11) {
                  pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
                  uVar5 = local_1a8._8_8_;
                  strlen(pcVar4);
                  std::__cxx11::string::_M_replace((ulong)local_1a8,0,(char *)uVar5,(ulong)pcVar4);
                  std::__cxx11::string::append(local_1a8);
                  std::__cxx11::string::_M_append
                            (local_1a8,
                             (ulong)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus.
                                    _M_p);
                }
                std::__cxx11::string::string
                          ((string *)&local_1c8,(char *)local_1a8._0_8_,&local_231);
                cmsys::SystemTools::CollapseFullPath(&local_220,&local_1c8);
                std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_220);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p,
                                  local_220.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                cmSourceGroup::AddGroupFile(local_230,(string *)local_1a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._0_8_ != local_198) {
                  operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
                }
              }
            }
            uVar9 = (ulong)(uVar8 + 1);
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar6 = (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
            bVar11 = uVar6 <= uVar9;
          } while (uVar9 < uVar6);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar11;
}

Assistant:

bool cmSourceGroupCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string delimiter = "\\";
  if(this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER"))
    {
    delimiter = this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER");
    }

  std::vector<std::string> folders =
    cmSystemTools::tokenize(args[0], delimiter);

  cmSourceGroup* sg = 0;
  sg = this->Makefile->GetSourceGroup(folders);
  if(!sg)
    {
    this->Makefile->AddSourceGroup(folders);
    sg = this->Makefile->GetSourceGroup(folders);
    }

  if(!sg)
    {
    this->SetError("Could not create or find source group");
    return false;
    }
  // If only two arguments are given, the pre-1.8 version of the
  // command is being invoked.
  if(args.size() == 2  && args[1] != "FILES")
    {
    sg->SetGroupRegex(args[1].c_str());
    return true;
    }

  // Process arguments.
  bool doingFiles = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "REGULAR_EXPRESSION")
      {
      // Next argument must specify the regex.
      if(i+1 < args.size())
        {
        ++i;
        sg->SetGroupRegex(args[i].c_str());
        }
      else
        {
        this->SetError("REGULAR_EXPRESSION argument given without a regex.");
        return false;
        }
      doingFiles = false;
      }
    else if(args[i] == "FILES")
      {
      // Next arguments will specify files.
      doingFiles = true;
      }
    else if(doingFiles)
      {
      // Convert name to full path and add to the group's list.
      std::string src = args[i];
      if(!cmSystemTools::FileIsFullPath(src.c_str()))
        {
        src = this->Makefile->GetCurrentSourceDirectory();
        src += "/";
        src += args[i];
        }
      src = cmSystemTools::CollapseFullPath(src.c_str());
      sg->AddGroupFile(src);
      }
    else
      {
      std::ostringstream err;
      err << "Unknown argument \"" << args[i] << "\".  "
          << "Perhaps the FILES keyword is missing.\n";
      this->SetError(err.str());
      return false;
      }
    }

  return true;
}